

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jmespath_error.hpp
# Opt level: O3

string * __thiscall
jsoncons::jmespath::jmespath_error_category_impl::message_abi_cxx11_
          (string *__return_storage_ptr__,jmespath_error_category_impl *this,int ev)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(ev) {
  case 1:
    pcVar2 = "Expected identifier";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Expected index";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "Expected A-Z, a-z, or _";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "Expected ]";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "Expected )";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "Expected }";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "Expected :";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "Expected \".\"";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "Expected \"||\"";
    pcVar1 = "";
    break;
  case 10:
    pcVar2 = "Expected \"&&\"";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "Expected multi-select-list";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "Invalid number";
    pcVar1 = "";
    break;
  case 0xd:
    pcVar2 = "Invalid literal";
    pcVar1 = "";
    break;
  case 0xe:
    pcVar2 = "Expected <, <=, ==, >=, > or !=";
    pcVar1 = "";
    break;
  case 0xf:
    pcVar2 = "Expected key";
    pcVar1 = "";
    break;
  case 0x10:
    pcVar2 = "Invalid argument type";
    pcVar1 = "";
    break;
  case 0x11:
    pcVar2 = "Unknown function";
    pcVar1 = "";
    break;
  case 0x12:
    pcVar2 = "Invalid type";
    pcVar1 = "";
    break;
  case 0x13:
    pcVar2 = "Unexpected end of jmespath input";
    pcVar1 = "";
    break;
  case 0x14:
    pcVar2 = "Slice step cannot be zero";
    pcVar1 = "";
    break;
  case 0x15:
    pcVar2 = "Syntax error";
    pcVar1 = "";
    break;
  case 0x16:
    pcVar2 = "Invalid codepoint";
    pcVar1 = "";
    break;
  case 0x17:
    pcVar2 = "Illegal escaped character";
    pcVar1 = "";
    break;
  case 0x18:
    pcVar2 = "Unbalanced parentheses";
    pcVar1 = "";
    break;
  case 0x19:
    pcVar2 = "Unbalanced braces";
    pcVar1 = "";
    break;
  case 0x1a:
    pcVar2 = "Function called with wrong number of arguments";
    pcVar1 = "";
    break;
  case 0x1b:
    pcVar2 = "Identifier not found";
    pcVar1 = "";
    break;
  case 0x1c:
    pcVar2 = "Expected index expression";
    pcVar1 = "";
    break;
  case 0x1d:
    pcVar2 = "Undefined variable";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "Unknown jmespath parser error";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int ev) const override
    {
        switch (static_cast<jmespath_errc>(ev))
        {
            case jmespath_errc::expected_identifier:
                return "Expected identifier";
            case jmespath_errc::expected_index:
                return "Expected index";
            case jmespath_errc::expected_A_Za_Z_:
                return "Expected A-Z, a-z, or _";
            case jmespath_errc::expected_rbracket:
                return "Expected ]";
            case jmespath_errc::expected_rparen:
                return "Expected )";
            case jmespath_errc::expected_rbrace:
                return "Expected }";
            case jmespath_errc::expected_colon:
                return "Expected :";
            case jmespath_errc::expected_dot:
                return "Expected \".\"";
            case jmespath_errc::expected_or:
                return "Expected \"||\"";
            case jmespath_errc::expected_and:
                return "Expected \"&&\"";
            case jmespath_errc::expected_multi_select_list:
                return "Expected multi-select-list";
            case jmespath_errc::invalid_number:
                return "Invalid number";
            case jmespath_errc::invalid_literal:
                return "Invalid literal";
            case jmespath_errc::expected_comparator:
                return "Expected <, <=, ==, >=, > or !=";
            case jmespath_errc::expected_key:
                return "Expected key";
            case jmespath_errc::invalid_argument:
                return "Invalid argument type";
            case jmespath_errc::unknown_function:
                return "Unknown function";
            case jmespath_errc::invalid_type:
                return "Invalid type";
            case jmespath_errc::unexpected_end_of_input:
                return "Unexpected end of jmespath input";
            case jmespath_errc::step_cannot_be_zero:
                return "Slice step cannot be zero";
            case jmespath_errc::syntax_error:
                return "Syntax error";
            case jmespath_errc::invalid_codepoint:
                return "Invalid codepoint";
            case jmespath_errc::illegal_escaped_character:
                return "Illegal escaped character";
            case jmespath_errc::unbalanced_parentheses:
                return "Unbalanced parentheses";
            case jmespath_errc::unbalanced_braces:
                return "Unbalanced braces";
            case jmespath_errc::invalid_arity:
                return "Function called with wrong number of arguments";
            case jmespath_errc::identifier_not_found:
                return "Identifier not found";
            case jmespath_errc::expected_index_expression:
                return "Expected index expression";
            case jmespath_errc::undefined_variable:
                return "Undefined variable";
            case jmespath_errc::unknown_error:
            default:
                return "Unknown jmespath parser error";
        }
    }